

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O2

void __thiscall
booster::locale::details::format_parser::format_parser
          (format_parser *this,ios_base *ios,void *cookie,_func_void_void_ptr_locale_ptr *imbuer)

{
  data *pdVar1;
  ios_info *other;
  unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
  *puVar2;
  locale local_30;
  
  this->ios_ = ios;
  pdVar1 = (data *)operator_new(0x88);
  data::data(pdVar1);
  puVar2 = &this->d;
  (puVar2->_M_t).
  super___uniq_ptr_impl<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
  ._M_t.
  super__Tuple_impl<0UL,_booster::locale::details::format_parser::data_*,_std::default_delete<booster::locale::details::format_parser::data>_>
  .super__Head_base<0UL,_booster::locale::details::format_parser::data_*,_false>._M_head_impl =
       pdVar1;
  pdVar1->position = 0xffffffff;
  pdVar1->precision = *(streamsize *)(ios + 8);
  pdVar1->flags = *(fmtflags *)(ios + 0x18);
  other = ios_info::get(ios);
  ios_info::operator=(&((puVar2->_M_t).
                        super___uniq_ptr_impl<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_booster::locale::details::format_parser::data_*,_std::default_delete<booster::locale::details::format_parser::data>_>
                        .
                        super__Head_base<0UL,_booster::locale::details::format_parser::data_*,_false>
                       ._M_head_impl)->info,other);
  std::locale::locale(&local_30,(locale *)(ios + 0xd0));
  std::locale::operator=
            (&((puVar2->_M_t).
               super___uniq_ptr_impl<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
               ._M_t.
               super__Tuple_impl<0UL,_booster::locale::details::format_parser::data_*,_std::default_delete<booster::locale::details::format_parser::data>_>
               .super__Head_base<0UL,_booster::locale::details::format_parser::data_*,_false>.
              _M_head_impl)->saved_locale,&local_30);
  std::locale::~locale(&local_30);
  pdVar1 = (puVar2->_M_t).
           super___uniq_ptr_impl<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
           ._M_t.
           super__Tuple_impl<0UL,_booster::locale::details::format_parser::data_*,_std::default_delete<booster::locale::details::format_parser::data>_>
           .super__Head_base<0UL,_booster::locale::details::format_parser::data_*,_false>.
           _M_head_impl;
  pdVar1->restore_locale = false;
  pdVar1->cookie = cookie;
  ((puVar2->_M_t).
   super___uniq_ptr_impl<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
   ._M_t.
   super__Tuple_impl<0UL,_booster::locale::details::format_parser::data_*,_std::default_delete<booster::locale::details::format_parser::data>_>
   .super__Head_base<0UL,_booster::locale::details::format_parser::data_*,_false>._M_head_impl)->
  imbuer = imbuer;
  return;
}

Assistant:

format_parser::format_parser(std::ios_base &ios,void *cookie,void (*imbuer)(void *,std::locale const &)) : 
                ios_(ios),
                d(new data)
            {
                d->position=std::numeric_limits<unsigned>::max();
                d->precision=ios.precision();
                d->flags = ios.flags();
                d->info=ios_info::get(ios);
                d->saved_locale = ios.getloc();
                d->restore_locale=false;
                d->cookie = cookie;
                d->imbuer = imbuer;
            }